

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint lodepng_deflate(uchar **out,size_t *outsize,uchar *in,size_t insize,
                    LodePNGCompressSettings *settings)

{
  uint uVar1;
  size_t *in_RSI;
  undefined8 *in_RDI;
  ucvector v;
  uint error;
  size_t in_stack_00000048;
  uchar *in_stack_00000050;
  ucvector *in_stack_00000058;
  ucvector local_48 [2];
  size_t *local_10;
  undefined8 *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  ucvector_init_buffer(local_48,(uchar *)*in_RDI,*in_RSI);
  uVar1 = lodepng_deflatev(in_stack_00000058,in_stack_00000050,in_stack_00000048,
                           (LodePNGCompressSettings *)out);
  *local_8 = local_48[0].data;
  *local_10 = local_48[0].size;
  return uVar1;
}

Assistant:

unsigned lodepng_deflate(unsigned char** out, size_t* outsize,
                         const unsigned char* in, size_t insize,
                         const LodePNGCompressSettings* settings)
{
  unsigned error;
  ucvector v;
  ucvector_init_buffer(&v, *out, *outsize);
  error = lodepng_deflatev(&v, in, insize, settings);
  *out = v.data;
  *outsize = v.size;
  return error;
}